

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcDebugSetBreakFunction(void *context,_func_uint_void_ptr_uint *callback)

{
  if ((NULLC::executorX86 != (ExecutorX86 *)0x0) &&
     (ExecutorX86::SetBreakFunction(NULLC::executorX86,context,callback),
     NULLC::executorRegVm != (ExecutorRegVm *)0x0)) {
    ExecutorRegVm::SetBreakFunction(NULLC::executorRegVm,context,callback);
    return '\x01';
  }
  NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  return '\0';
}

Assistant:

nullres nullcDebugSetBreakFunction(void *context, unsigned (*callback)(void*, unsigned))
{
	using namespace NULLC;

#ifdef NULLC_BUILD_X86_JIT
	if(!executorX86)
	{
		nullcLastError = "ERROR: NULLC is not initialized";
		return false;
	}
	executorX86->SetBreakFunction(context, callback);
#endif

	if(!executorRegVm)
	{
		nullcLastError = "ERROR: NULLC is not initialized";
		return false;
	}
	executorRegVm->SetBreakFunction(context, callback);

	return true;
}